

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O1

void __thiscall vkb::Result<vkb::SystemInfo>::destroy(Result<vkb::SystemInfo> *this)

{
  pointer pVVar1;
  pointer pVVar2;
  
  if (this->m_init == true) {
    pVVar1 = (this->field_0).m_value.available_extensions.
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1,(long)(this->field_0).m_value.available_extensions.
                                   super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1
                     );
    }
    pVVar2 = (this->field_0).m_value.available_layers.
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pVVar2 != (pointer)0x0) {
      operator_delete(pVVar2,(long)(this->field_0).m_value.available_layers.
                                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2
                     );
      return;
    }
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }